

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

float fastsinrc(float x)

{
  float fVar1;
  float fVar2;
  
  fVar1 = fmodf(x,6.2831855);
  if (fVar1 <= 4.712389) {
    if (1.5707964 < fVar1) {
      fVar1 = 3.1415927 - fVar1;
    }
  }
  else {
    fVar1 = fVar1 + -6.2831855;
  }
  fVar2 = fVar1 * fVar1;
  return (((fVar2 * -0.00018542 + 0.0083143) * fVar2 + -0.16666) * fVar2 + 1.0) * fVar1;
}

Assistant:

static float fastsinrc(float x)
{
    // @@@BUG
    // NB this range reduction really only works for values >=0,
    // yet FM-sine oscillators will also pass in negative values.
    // This is not a good idea. At all. But it's what the original
    // V2 code does. :)

    // first range reduction: mod with 2pi
    x = fmodf(x, fc2pi);
    // now x in [-2pi,2pi]

#if !BUG_V2_FM_RANGE
    if (x < 0.0f)
        x += fc2pi;
#endif

    // need to reduce to [-pi/2, pi/2] to call fastsin
    if (x > fc1p5pi) // x in (3pi/2,2pi]
        x -= fc2pi; // sin(x) = sin(x-2pi)
    else if (x > fcpi_2) // x in (pi/2,3pi/2]
        x = fcpi - x; // sin(x) = -sin(x-pi) = sin(-(x-pi)) = sin(pi-x)

    return fastsin(x);
}